

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void ByteCodeGenerator::Generate
               (ParseNodeProg *pnodeProg,uint32 grfscr,ByteCodeGenerator *byteCodeGenerator,
               ParseableFunctionInfo **ppRootFunc,uint sourceIndex,bool forceNoNative,Parser *parser
               ,ScriptFunction **functionRef)

{
  void **this;
  ScriptContext *this_00;
  ThreadContext *pTVar1;
  SourceContextInfo *this_01;
  ParseableFunctionInfo *this_02;
  NativeCodeGenerator *nativeCodeGen;
  FunctionBody *fn;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Utf8SourceInfo *this_03;
  undefined4 *puVar5;
  int initialFunctionCount;
  undefined1 local_e0 [8];
  ArenaAllocator localAlloc;
  ParseNodeWalker<WalkerPolicyTest> walker;
  AutoFinalizeFuncInfos local_50;
  AutoFinalizeFuncInfos autoFinalizeFuncInfos;
  
  this = &localAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
          freeList;
  localAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       &PTR_WalkChild_014f2cb8;
  autoFinalizeFuncInfos.byteCodeGenerator = (ByteCodeGenerator *)ppRootFunc;
  ParseNodeWalker<WalkerPolicyTest>::Walk
            ((ParseNodeWalker<WalkerPolicyTest> *)this,(ParseNode *)pnodeProg,(Context)this);
  this_00 = byteCodeGenerator->scriptContext;
  Js::ScriptContext::ProfileBegin(this_00,ByteCodePhase);
  pTVar1 = this_00->threadContext;
  this_03 = Js::ScriptContext::GetSource(this_00,sourceIndex);
  byteCodeGenerator->m_utf8SourceInfo = this_03;
  this_01 = (((this_03->m_srcInfo).ptr)->sourceContextInfo).ptr;
  initialFunctionCount = 4;
  if ((grfscr & 0x20) == 0) {
    initialFunctionCount = this_01->nextLocalFunctionId - (pnodeProg->super_ParseNodeFnc).functionId
    ;
  }
  Js::Utf8SourceInfo::EnsureInitialized(this_03,initialFunctionCount);
  SourceContextInfo::EnsureInitialized(this_01);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_e0,
             L"ByteCode",&(pTVar1->pageAllocator).super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  byteCodeGenerator->parser = parser;
  byteCodeGenerator->sourceIndex = sourceIndex;
  local_50.byteCodeGenerator = byteCodeGenerator;
  Begin(byteCodeGenerator,(ArenaAllocator *)local_e0,grfscr,
        (ParseableFunctionInfo *)(autoFinalizeFuncInfos.byteCodeGenerator)->scriptContext);
  byteCodeGenerator->functionRef = functionRef;
  Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
            ((ParseNode *)pnodeProg,byteCodeGenerator,Bind,AssignRegisters,(ParseNode *)0x0);
  byteCodeGenerator->forceNoNative = forceNoNative;
  EmitProgram(byteCodeGenerator,pnodeProg);
  if ((byteCodeGenerator->flags & 0x400) != 0) {
    this_02 = byteCodeGenerator->pRootFunc;
    bVar3 = Js::FunctionProxy::IsFunctionBody(&this_02->super_FunctionProxy);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar3) goto LAB_008326b4;
      *puVar5 = 0;
    }
    uVar4 = 0x20;
    if (byteCodeGenerator->funcEscapes == false) {
      uVar4 = (uint)pnodeProg->m_UsesArgumentsAtGlobal << 5;
    }
    *(uint *)&this_02[2].super_FunctionProxy.auxPtrs.ptr =
         *(uint *)&this_02[2].super_FunctionProxy.auxPtrs.ptr & 0xffffffdf | uVar4;
  }
  CheckDeferParseHasMaybeEscapedNestedFunc(byteCodeGenerator);
  Js::ScriptContext::ProfileEnd(this_00,ByteCodePhase);
  if ((((byteCodeGenerator->forceNoNative == false) && ((this_00->config).NoNative == false)) &&
      (-1 < (short)grfscr)) && (DAT_015c4a8a != '\0')) {
    nativeCodeGen = this_00->nativeCodeGen;
    fn = (FunctionBody *)byteCodeGenerator->pRootFunc;
    bVar3 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)fn);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar3) {
LAB_008326b4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    GenerateAllFunctions(nativeCodeGen,fn);
  }
  (autoFinalizeFuncInfos.byteCodeGenerator)->scriptContext =
       (ScriptContext *)byteCodeGenerator->pRootFunc;
  Generate::AutoFinalizeFuncInfos::~AutoFinalizeFuncInfos(&local_50);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_e0);
  return;
}

Assistant:

void ByteCodeGenerator::Generate(__in ParseNodeProg *pnodeProg, uint32 grfscr, __in ByteCodeGenerator* byteCodeGenerator,
    __inout Js::ParseableFunctionInfo ** ppRootFunc, __in uint sourceIndex,
    __in bool forceNoNative, __in Parser* parser, Js::ScriptFunction **functionRef)
{
#if DBG
    struct WalkerPolicyTest : public WalkerPolicyBase<bool, ParseNodeWalker<WalkerPolicyTest>*>
    {
        inline bool ContinueWalk(ResultType) { return ThreadContext::IsCurrentStackAvailable(Js::Constants::MinStackByteCodeVisitor); }
        virtual ResultType WalkChild(ParseNode *pnode, ParseNodeWalker<WalkerPolicyTest>* walker) { return ContinueWalk(true) && walker->Walk(pnode, walker); }
    };
    ParseNodeWalker<WalkerPolicyTest> walker;
    // Just walk the ast to see if our walker encounters any problems
    walker.Walk(pnodeProg, &walker);
#endif
    Js::ScriptContext * scriptContext = byteCodeGenerator->scriptContext;

#ifdef PROFILE_EXEC
    scriptContext->ProfileBegin(Js::ByteCodePhase);
#endif
    JS_ETW_INTERNAL(EventWriteJSCRIPT_BYTECODEGEN_START(scriptContext, 0));

    ThreadContext * threadContext = scriptContext->GetThreadContext();
    Js::Utf8SourceInfo * utf8SourceInfo = scriptContext->GetSource(sourceIndex);
    byteCodeGenerator->m_utf8SourceInfo = utf8SourceInfo;

    // For dynamic code, just provide a small number since that source info should have very few functions
    // For static code, the nextLocalFunctionId is a good guess of the initial size of the array to minimize reallocs
    SourceContextInfo * sourceContextInfo = utf8SourceInfo->GetSrcInfo()->sourceContextInfo;
    utf8SourceInfo->EnsureInitialized((grfscr & fscrDynamicCode) ? 4 : (sourceContextInfo->nextLocalFunctionId - pnodeProg->functionId));
    sourceContextInfo->EnsureInitialized();

    ArenaAllocator localAlloc(_u("ByteCode"), threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);

    // Make sure FuncInfo's get finalized when byte code gen is done.
    struct AutoFinalizeFuncInfos {
        AutoFinalizeFuncInfos(ByteCodeGenerator * byteCodeGenerator) : byteCodeGenerator(byteCodeGenerator) {}
        ~AutoFinalizeFuncInfos() {
            if (byteCodeGenerator)
            {
                byteCodeGenerator->FinalizeFuncInfos();
            }
        }
        ByteCodeGenerator * byteCodeGenerator;
    } autoFinalizeFuncInfos(byteCodeGenerator);

    byteCodeGenerator->parser = parser;
    byteCodeGenerator->SetCurrentSourceIndex(sourceIndex);
    byteCodeGenerator->Begin(&localAlloc, grfscr, *ppRootFunc);
    byteCodeGenerator->functionRef = functionRef;
    Visit(pnodeProg, byteCodeGenerator, Bind, AssignRegisters);

    byteCodeGenerator->forceNoNative = forceNoNative;
    byteCodeGenerator->EmitProgram(pnodeProg);

    if (byteCodeGenerator->flags & fscrEval)
    {
        // The eval caller's frame always escapes if eval refers to the caller's arguments.
        byteCodeGenerator->GetRootFunc()->GetFunctionBody()->SetFuncEscapes(
            byteCodeGenerator->funcEscapes || pnodeProg->m_UsesArgumentsAtGlobal);
    }

#ifdef IR_VIEWER
    if (grfscr & fscrIrDumpEnable)
    {
        byteCodeGenerator->GetRootFunc()->GetFunctionBody()->SetIRDumpEnabled(true);
    }
#endif /* IR_VIEWER */

    byteCodeGenerator->CheckDeferParseHasMaybeEscapedNestedFunc();

#ifdef PROFILE_EXEC
    scriptContext->ProfileEnd(Js::ByteCodePhase);
#endif
    JS_ETW_INTERNAL(EventWriteJSCRIPT_BYTECODEGEN_STOP(scriptContext, 0));

#if ENABLE_NATIVE_CODEGEN && defined(ENABLE_PREJIT)
    if (!byteCodeGenerator->forceNoNative && !scriptContext->GetConfig()->IsNoNative()
        && Js::Configuration::Global.flags.Prejit
        && (grfscr & fscrNoPreJit) == 0)
    {
        GenerateAllFunctions(scriptContext->GetNativeCodeGenerator(), byteCodeGenerator->GetRootFunc()->GetFunctionBody());
    }
#endif

    if (ppRootFunc)
    {
        *ppRootFunc = byteCodeGenerator->GetRootFunc();
    }

#ifdef PERF_COUNTERS
    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: deferparse - # of func: %d # deferparsed: %d\n"),
        PerfCounter::CodeCounterSet::GetTotalFunctionCounter().GetValue(), PerfCounter::CodeCounterSet::GetDeferredFunctionCounter().GetValue());
#endif
}